

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
protozero::ScatteredStreamWriter::WriteBytesSlowPath
          (ScatteredStreamWriter *this,uint8_t *src,size_t size)

{
  unsigned_long *puVar1;
  size_t local_38;
  size_t local_30;
  size_t burst_size;
  size_t bytes_left;
  size_t size_local;
  uint8_t *src_local;
  ScatteredStreamWriter *this_local;
  
  bytes_left = size;
  size_local = (size_t)src;
  src_local = (uint8_t *)this;
  for (burst_size = size; burst_size != 0; burst_size = burst_size - local_30) {
    if ((this->cur_range_).end <= this->write_ptr_) {
      Extend(this);
    }
    local_38 = bytes_available(this);
    puVar1 = std::min<unsigned_long>(&local_38,&burst_size);
    local_30 = *puVar1;
    WriteBytesUnsafe(this,(uint8_t *)size_local,local_30);
    size_local = local_30 + size_local;
  }
  return;
}

Assistant:

void ScatteredStreamWriter::WriteBytesSlowPath(const uint8_t* src,
                                               size_t size) {
  size_t bytes_left = size;
  while (bytes_left > 0) {
    if (write_ptr_ >= cur_range_.end)
      Extend();
    const size_t burst_size = std::min(bytes_available(), bytes_left);
    WriteBytesUnsafe(src, burst_size);
    bytes_left -= burst_size;
    src += burst_size;
  }
}